

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

void __thiscall
wasm::FunctionValidator::validateNormalBlockElements(FunctionValidator *this,Block *curr)

{
  size_t sVar1;
  Type right;
  Type left;
  bool bVar2;
  ulong uVar3;
  ostringstream *poVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((1 < (curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
           usedElements) &&
     (uVar3 = (curr->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements, uVar3 != 1)) {
    uVar6 = 0;
    uVar7 = 1;
    do {
      if (uVar3 <= uVar6) goto LAB_009d083a;
      bVar2 = ValidationInfo::shouldBeTrue<wasm::Block*>
                        (this->info,
                         ((curr->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .data[uVar6]->type).id < 2,curr,
                         "non-final block elements returning a value must be drop()ed (binaryen\'s autodrop option might help you)"
                         ,(this->
                          super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                          ).
                          super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                          .
                          super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                          .currFunction);
      if ((!bVar2) && (this->info->quiet == false)) {
        poVar4 = ValidationInfo::getStream_abi_cxx11_
                           (this->info,
                            (this->
                            super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                            ).
                            super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                            .
                            super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                            .currFunction);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"(on index ",10);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,":\n",2);
        if ((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
            usedElements <= uVar6) {
LAB_009d083a:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n), type: ",10);
        if ((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
            usedElements <= uVar6) goto LAB_009d083a;
        poVar5 = wasm::operator<<(poVar5,(Type)((curr->list).
                                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                                .data[uVar6]->type).id);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      }
      uVar3 = (curr->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements;
      bVar2 = uVar7 < uVar3 - 1;
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar2);
  }
  sVar1 = (curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements;
  if (sVar1 != 0) {
    right.id = (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
    left.id = ((curr->list).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
               [sVar1 - 1]->type).id;
    if (right.id < 2) {
      ValidationInfo::shouldBeFalse<wasm::Block*>
                (this->info,1 < left.id,curr,
                 "if block is not returning a value, final element should not flow out a value",
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                 ).
                 super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 .
                 super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 .currFunction);
    }
    else if (left.id < 2) {
      ValidationInfo::shouldBeUnequal<wasm::Block*,wasm::Type>
                (this->info,left,(Type)0x0,curr,
                 "block with value must not have last element that is none",
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                 ).
                 super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 .
                 super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 .currFunction);
    }
    else {
      shouldBeSubType(this,left,right,(Expression *)curr,
                      "block with value and last element with value must match types");
    }
  }
  if (1 < (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id) {
    ValidationInfo::shouldBeTrue<wasm::Block*>
              (this->info,
               (curr->list).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements != 0,curr,"block with a value must not be empty",
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .currFunction);
    return;
  }
  return;
}

Assistant:

void FunctionValidator::validateNormalBlockElements(Block* curr) {
  if (curr->list.size() > 1) {
    for (Index i = 0; i < curr->list.size() - 1; i++) {
      if (!shouldBeTrue(
            !curr->list[i]->type.isConcrete(),
            curr,
            "non-final block elements returning a value must be drop()ed "
            "(binaryen's autodrop option might help you)") &&
          !info.quiet) {
        getStream() << "(on index " << i << ":\n"
                    << curr->list[i] << "\n), type: " << curr->list[i]->type
                    << "\n";
      }
    }
  }
  if (curr->list.size() > 0) {
    auto backType = curr->list.back()->type;
    if (!curr->type.isConcrete()) {
      shouldBeFalse(backType.isConcrete(),
                    curr,
                    "if block is not returning a value, final element should "
                    "not flow out a value");
    } else {
      if (backType.isConcrete()) {
        shouldBeSubType(
          backType,
          curr->type,
          curr,
          "block with value and last element with value must match types");
      } else {
        shouldBeUnequal(
          backType,
          Type(Type::none),
          curr,
          "block with value must not have last element that is none");
      }
    }
  }
  if (curr->type.isConcrete()) {
    shouldBeTrue(
      curr->list.size() > 0, curr, "block with a value must not be empty");
  }
}